

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_>::freeData
          (Span<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_> *this)

{
  byte bVar1;
  char16_t *pcVar2;
  Node<std::pair<QString,_QString>,_QString> *pNVar3;
  Node<std::pair<QString,_QString>,_QString> *in_RDI;
  uchar o;
  uchar *__end4;
  uchar *__begin4;
  uchar (*__range4) [128];
  Node<std::pair<QString,_QString>,_QString> *local_18;
  
  if (in_RDI[1].value.d.ptr != (char16_t *)0x0) {
    pNVar3 = in_RDI + 1;
    for (local_18 = in_RDI;
        local_18 != (Node<std::pair<QString,_QString>,_QString> *)&(pNVar3->value).d.ptr;
        local_18 = (Node<std::pair<QString,_QString>,_QString> *)
                   ((long)&(local_18->key).first.d.d + 1)) {
      bVar1 = *(byte *)&(local_18->key).first.d.d;
      if (bVar1 != 0xff) {
        Entry::node((Entry *)(in_RDI[1].value.d.ptr + (ulong)bVar1 * 0x24));
        Node<std::pair<QString,_QString>,_QString>::~Node(in_RDI);
      }
    }
    pcVar2 = in_RDI[1].value.d.ptr;
    if (pcVar2 != (char16_t *)0x0) {
      operator_delete__(pcVar2);
    }
    in_RDI[1].value.d.ptr = (char16_t *)0x0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }